

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::handleFunctionArgument
          (HlslParseContext *this,TFunction *function,TIntermTyped **arguments,TIntermTyped *newArg)

{
  int iVar1;
  TType *this_00;
  undefined4 extraout_var;
  TParameter param;
  
  param.name = (TString *)0x0;
  this_00 = (TType *)TType::operator_new((TType *)0x98,(size_t)function);
  TType::TType(this_00,EbtVoid,EvqTemporary,1,0,0,false);
  param.defaultValue = (TIntermTyped *)0x0;
  param.type = this_00;
  iVar1 = (*(newArg->super_TIntermNode)._vptr_TIntermNode[0x1e])(newArg);
  TType::shallowCopy(this_00,(TType *)CONCAT44(extraout_var,iVar1));
  (*(function->super_TSymbol)._vptr_TSymbol[0x16])(function,&param);
  if (*arguments != (TIntermTyped *)0x0) {
    newArg = (TIntermTyped *)
             TIntermediate::growAggregate
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        &(*arguments)->super_TIntermNode,&newArg->super_TIntermNode);
  }
  *arguments = newArg;
  return;
}

Assistant:

void HlslParseContext::handleFunctionArgument(TFunction* function,
                                              TIntermTyped*& arguments, TIntermTyped* newArg)
{
    TParameter param = { nullptr, new TType, nullptr };
    param.type->shallowCopy(newArg->getType());

    function->addParameter(param);
    if (arguments)
        arguments = intermediate.growAggregate(arguments, newArg);
    else
        arguments = newArg;
}